

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_free(ptls_t *tls)

{
  long lVar1;
  void *in_RDI;
  ptls_iovec_t pVar2;
  ptls_iovec_t pVar3;
  ssize_t in_stack_ffffffffffffffa8;
  ptls_context_t *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int is_early;
  ptls_t *in_stack_ffffffffffffffc0;
  code *pcVar4;
  ptls_buffer_t *local_38;
  uint8_t *local_28;
  size_t local_20;
  uint8_t *local_18;
  size_t local_10;
  
  is_early = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  ptls_buffer_dispose(local_38);
  ptls_buffer_dispose(local_38);
  free_exporter_master_secret(in_stack_ffffffffffffffc0,is_early);
  free_exporter_master_secret(in_stack_ffffffffffffffc0,is_early);
  if (*(long *)((long)in_RDI + 0x148) != 0) {
    free_esni_secret((ptls_esni_secret_t **)in_stack_ffffffffffffffb0,
                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  if (*(long *)((long)in_RDI + 0x50) != 0) {
    key_schedule_free((ptls_key_schedule_t *)in_stack_ffffffffffffffb0);
  }
  if (*(long *)((long)in_RDI + 0xa0) != 0) {
    ptls_aead_free((ptls_aead_context_t *)0x10b47e);
  }
  if (*(long *)((long)in_RDI + 0xf8) != 0) {
    ptls_aead_free((ptls_aead_context_t *)0x10b49e);
  }
  free(*(void **)((long)in_RDI + 0x108));
  free(*(void **)((long)in_RDI + 0x110));
  if ((*(byte *)((long)in_RDI + 0x160) & 1) == 0) {
    if (*(long *)((long)in_RDI + 0x198) != 0) {
      pcVar4 = *(code **)(*(long *)((long)in_RDI + 0x198) + 0x18);
      lVar1 = (long)in_RDI + 0x198;
      pVar2 = ptls_iovec_init((void *)0x0,0);
      local_18 = pVar2.base;
      local_10 = pVar2.len;
      (*pcVar4)(lVar1,1,0,local_18,local_10);
    }
    if (*(long *)((long)in_RDI + 0x1a8) != 0) {
      free(*(void **)((long)in_RDI + 0x1a8));
    }
  }
  if (*(long *)((long)in_RDI + 0x1e0) != 0) {
    in_stack_ffffffffffffffb0 = *(ptls_context_t **)((long)in_RDI + 0x1e0);
    in_stack_ffffffffffffffa8 = *(ssize_t *)((long)in_RDI + 0x1e8);
    pVar2 = ptls_iovec_init((void *)0x0,0);
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_28 = pVar2.base;
    local_20 = pVar2.len;
    local_38 = (ptls_buffer_t *)pVar3.base;
    (*(code *)in_stack_ffffffffffffffb0)
              (in_stack_ffffffffffffffa8,0,local_28,local_20,local_38,pVar3.len);
  }
  if (*(long *)((long)in_RDI + 0x1f0) != 0) {
    (*ptls_clear_memory)(*(void **)((long)in_RDI + 0x1f0),0x40);
    free(*(void **)((long)in_RDI + 0x1f0));
  }
  update_open_count(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (*ptls_clear_memory)(in_RDI,0x200);
  free(in_RDI);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    PTLS_PROBE0(FREE, tls);
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    free_exporter_master_secret(tls, 1);
    free_exporter_master_secret(tls, 0);
    if (tls->esni != NULL)
        free_esni_secret(&tls->esni, tls->is_server);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    free(tls->negotiated_protocol);
    if (tls->is_server) {
        /* nothing to do */
    } else {
        if (tls->client.key_share_ctx != NULL)
            tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        if (tls->client.certificate_request.context.base != NULL)
            free(tls->client.certificate_request.context.base);
    }
    if (tls->certificate_verify.cb != NULL) {
        tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, 0, ptls_iovec_init(NULL, 0), ptls_iovec_init(NULL, 0));
    }
    if (tls->pending_handshake_secret != NULL) {
        ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
        free(tls->pending_handshake_secret);
    }
    update_open_count(tls->ctx, -1);
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}